

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

TaprootBuilder * __thiscall TaprootBuilder::AddOmitted(TaprootBuilder *this,int depth,uint256 *hash)

{
  long in_FS_OFFSET;
  NodeInfo local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_valid == true) {
    local_48.leaves.
    super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.leaves.
    super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.leaves.
    super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(hash->super_base_blob<256U>).m_data._M_elems;
    local_48.hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((hash->super_base_blob<256U>).m_data._M_elems + 8);
    local_48.hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)((hash->super_base_blob<256U>).m_data._M_elems + 0x10);
    local_48.hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((hash->super_base_blob<256U>).m_data._M_elems + 0x18);
    Insert(this,&local_48,depth);
    std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::~vector
              (&local_48.leaves);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

TaprootBuilder& TaprootBuilder::AddOmitted(int depth, const uint256& hash)
{
    if (!IsValid()) return *this;
    /* Construct NodeInfo object with the hash directly, and insert it into the branch. */
    NodeInfo node;
    node.hash = hash;
    Insert(std::move(node), depth);
    return *this;
}